

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
::next_byte_in_range
          (lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<const_char_*>_>
           *this,initializer_list<int> ranges)

{
  int iVar1;
  long lVar2;
  int *piVar3;
  
  piVar3 = ranges._M_array;
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&this->token_buffer,(char)this->current);
  lVar2 = ranges._M_len << 2;
  do {
    if (lVar2 == 0) {
LAB_0030362b:
      return lVar2 == 0;
    }
    get(this);
    iVar1 = this->current;
    if ((iVar1 < *piVar3) || (piVar3[1] < iVar1)) {
      this->error_message = "invalid string: ill-formed UTF-8 byte";
      goto LAB_0030362b;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (&this->token_buffer,(char)iVar1);
    piVar3 = piVar3 + 2;
    lVar2 = lVar2 + -8;
  } while( true );
}

Assistant:

bool next_byte_in_range(std::initializer_list<char_int_type> ranges)
    {
        JSON_ASSERT(ranges.size() == 2 || ranges.size() == 4 || ranges.size() == 6);
        add(current);

        for (auto range = ranges.begin(); range != ranges.end(); ++range)
        {
            get();
            if (JSON_HEDLEY_LIKELY(*range <= current && current <= *(++range))) // NOLINT(bugprone-inc-dec-in-conditions)
            {
                add(current);
            }
            else
            {
                error_message = "invalid string: ill-formed UTF-8 byte";
                return false;
            }
        }

        return true;
    }